

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O1

void TranslateFunctionName(ExpressionTranslateContext *ctx,FunctionData *function)

{
  ScopeData *pSVar1;
  TypeBase *pTVar2;
  MatchData *pMVar3;
  InplaceStr name;
  InplaceStr IVar4;
  ulong uVar5;
  FunctionData *pFVar6;
  char *unaff_R12;
  char *pcVar7;
  char *unaff_R13;
  char *pcVar8;
  char *pcVar9;
  InplaceStr IVar10;
  InplaceStr name_00;
  
  pcVar8 = (function->name->name).begin;
  pcVar9 = (function->name->name).end;
  pFVar6 = function->implementation;
  if (function->implementation == (FunctionData *)0x0) {
    pFVar6 = function;
  }
  if (*pcVar8 == '$') {
    Print(ctx,"__");
    pcVar8 = pcVar8 + 1;
    if (pcVar9 < pcVar8) goto LAB_001564ad;
  }
  IVar4.end = pcVar9;
  IVar4.begin = pcVar8;
  IVar10.end = unaff_R13;
  IVar10.begin = unaff_R12;
  IVar10 = GetOperatorName(IVar10);
  if (IVar10.begin == IVar10.end) {
    IVar10 = IVar4;
  }
  pcVar9 = IVar10.end;
  pcVar8 = IVar10.begin;
  pSVar1 = pFVar6->scope;
  pTVar2 = pSVar1->ownerType;
  if (pTVar2 == (TypeBase *)0x0) {
    if (((pSVar1 != ctx->ctx->globalScope) && (pSVar1->ownerNamespace == (NamespaceData *)0x0)) ||
       (pFVar6->isHidden != false)) {
      PrintEscapedName(ctx,IVar10);
      for (pMVar3 = (pFVar6->generics).head; pMVar3 != (MatchData *)0x0; pMVar3 = pMVar3->next) {
        Print(ctx,"_");
        PrintEscapedTypeName(ctx,pMVar3->type);
        Print(ctx,"_");
      }
      Print(ctx,"_%d",(ulong)pFVar6->functionIndex);
      goto LAB_00156473;
    }
    PrintEscapedName(ctx,IVar10);
    for (pMVar3 = (pFVar6->generics).head; pMVar3 != (MatchData *)0x0; pMVar3 = pMVar3->next) {
      Print(ctx,"_");
      PrintEscapedTypeName(ctx,pMVar3->type);
      Print(ctx,"_");
    }
  }
  else {
    uVar5 = (long)(pTVar2->name).end - (long)(pTVar2->name).begin;
    pcVar7 = pcVar8;
    if ((int)uVar5 + 2U < (uint)((int)IVar10.end - (int)IVar10.begin)) {
      pcVar7 = pcVar8 + (uVar5 & 0xffffffff) + 2;
      if (pcVar9 < pcVar7) {
LAB_001564ad:
        __assert_fail("strEnd >= strBegin",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/StrAlgo.h"
                      ,0x28,"InplaceStr::InplaceStr(const char *, const char *)");
      }
      name.end = unaff_R13;
      name.begin = unaff_R12;
      name_00 = GetOperatorName(name);
      PrintEscapedTypeName(ctx,pFVar6->scope->ownerType);
      Print(ctx,"__");
      if (name_00.begin == name_00.end) goto LAB_00156407;
    }
    else {
LAB_00156407:
      name_00.end = pcVar9;
      name_00.begin = pcVar7;
    }
    PrintEscapedName(ctx,name_00);
    for (pMVar3 = (pFVar6->generics).head; pMVar3 != (MatchData *)0x0; pMVar3 = pMVar3->next) {
      Print(ctx,"_");
      PrintEscapedTypeName(ctx,pMVar3->type);
      Print(ctx,"_");
    }
  }
  Print(ctx,"_");
  PrintEscapedName(ctx,(pFVar6->type->super_TypeBase).name);
LAB_00156473:
  if ((pcVar8 != pcVar9) && (pcVar9[-1] == '$')) {
    Print(ctx,"_");
    return;
  }
  return;
}

Assistant:

void TranslateFunctionName(ExpressionTranslateContext &ctx, FunctionData *function)
{
	InplaceStr name = function->name->name;

	if(function->implementation)
		function = function->implementation;

	if(*name.begin == '$')
	{
		Print(ctx, "__");

		name = InplaceStr(name.begin + 1, name.end);
	}

	InplaceStr operatorName = GetOperatorName(name);

	if(!operatorName.empty())
		name = operatorName;

	if(function->scope->ownerType)
	{
		if(name.length() > function->scope->ownerType->name.length() + 2)
		{
			InplaceStr namePart = InplaceStr(name.begin + function->scope->ownerType->name.length() + 2, name.end);
			InplaceStr operatorName = GetOperatorName(namePart);

			if(!operatorName.empty())
			{
				PrintEscapedTypeName(ctx, function->scope->ownerType);
				Print(ctx, "__");
				PrintEscapedName(ctx, operatorName);
			}
			else
			{
				PrintEscapedTypeName(ctx, function->scope->ownerType);
				Print(ctx, "__");
				PrintEscapedName(ctx, namePart);
			}
		}
		else
		{
			PrintEscapedName(ctx, name);
		}

		for(MatchData *alias = function->generics.head; alias; alias = alias->next)
		{
			Print(ctx, "_");
			PrintEscapedTypeName(ctx, alias->type);
			Print(ctx, "_");
		}

		Print(ctx, "_");
		PrintEscapedName(ctx, function->type->name);
	}
	else if((function->scope == ctx.ctx.globalScope || function->scope->ownerNamespace) && !function->isHidden)
	{
		PrintEscapedName(ctx, name);

		for(MatchData *alias = function->generics.head; alias; alias = alias->next)
		{
			Print(ctx, "_");
			PrintEscapedTypeName(ctx, alias->type);
			Print(ctx, "_");
		}

		Print(ctx, "_");
		PrintEscapedName(ctx, function->type->name);
	}
	else
	{
		PrintEscapedName(ctx, name);

		for(MatchData *alias = function->generics.head; alias; alias = alias->next)
		{
			Print(ctx, "_");
			PrintEscapedTypeName(ctx, alias->type);
			Print(ctx, "_");
		}

		Print(ctx, "_%d", function->functionIndex);
	}

	if(!name.empty() && *(name.end - 1) == '$')
		Print(ctx, "_");
}